

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

CURLcode cf_h2_ctx_init(Curl_cfilter *cf,Curl_easy *data,_Bool via_h1_upgrade)

{
  Curl_easy *pCVar1;
  int iVar2;
  char *pcVar3;
  int ivlen;
  nghttp2_settings_entry iv [3];
  ssize_t binlen;
  uint8_t binsettings [80];
  nghttp2_session_callbacks *local_40;
  nghttp2_session_callbacks *cbs;
  int rc;
  CURLcode result;
  stream_ctx *stream;
  cf_h2_ctx *ctx;
  Curl_easy *pCStack_18;
  _Bool via_h1_upgrade_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  stream = (stream_ctx *)cf->ctx;
  cbs._4_4_ = CURLE_OUT_OF_MEMORY;
  local_40 = (nghttp2_session_callbacks *)0x0;
  ctx._7_1_ = via_h1_upgrade;
  pCStack_18 = data;
  data_local = (Curl_easy *)cf;
  Curl_bufcp_init((bufc_pool *)&(stream->h1).scratch.leng,0x4000,0x280);
  Curl_bufq_initp((bufq *)&(stream->recvbuf).spare,(bufc_pool *)&(stream->h1).scratch.leng,0x280,0);
  Curl_bufq_initp((bufq *)&(stream->sendbuf).spare,(bufc_pool *)&(stream->h1).scratch.leng,1,0);
  *(undefined4 *)((long)&(stream->h1).max_line_len + 4) = 0x7fffffff;
  cbs._0_4_ = nghttp2_session_callbacks_new(&local_40);
  if ((uint)cbs == 0) {
    nghttp2_session_callbacks_set_send_callback(local_40,send_callback);
    nghttp2_session_callbacks_set_on_frame_recv_callback(local_40,on_frame_recv);
    nghttp2_session_callbacks_set_on_frame_send_callback(local_40,on_frame_send);
    nghttp2_session_callbacks_set_on_data_chunk_recv_callback(local_40,on_data_chunk_recv);
    nghttp2_session_callbacks_set_on_stream_close_callback(local_40,on_stream_close);
    nghttp2_session_callbacks_set_on_begin_headers_callback(local_40,on_begin_headers);
    nghttp2_session_callbacks_set_on_header_callback(local_40,on_header);
    nghttp2_session_callbacks_set_error_callback(local_40,error_callback);
    cbs._0_4_ = h2_client_new((Curl_cfilter *)data_local,local_40);
    if ((uint)cbs == 0) {
      *(undefined4 *)&(stream->recvbuf).head = 100;
      if ((ctx._7_1_ & 1) == 0) {
        iVar2 = populate_settings((nghttp2_settings_entry *)&stack0xffffffffffffff48,pCStack_18);
        cbs._0_4_ = nghttp2_submit_settings
                              (*(nghttp2_session **)stream,'\0',
                               (nghttp2_settings_entry *)&stack0xffffffffffffff48,(long)iVar2);
        pCVar1 = pCStack_18;
        if ((uint)cbs != 0) {
          pcVar3 = nghttp2_strerror((uint)cbs);
          Curl_failf(pCVar1,"nghttp2_submit_settings() failed: %s(%d)",pcVar3,(ulong)(uint)cbs);
          cbs._4_4_ = CURLE_HTTP2;
          goto LAB_00c04f33;
        }
        cbs._0_4_ = 0;
      }
      else {
        iv[2] = (nghttp2_settings_entry)populate_binsettings((uint8_t *)&binlen,pCStack_18);
        if ((long)iv[2] < 1) {
          Curl_failf(pCStack_18,"nghttp2 unexpectedly failed on pack_settings_payload");
          cbs._4_4_ = CURLE_FAILED_INIT;
          goto LAB_00c04f33;
        }
        cbs._4_4_ = http2_data_setup((Curl_cfilter *)data_local,pCStack_18,(stream_ctx **)&rc);
        if (cbs._4_4_ != CURLE_OK) goto LAB_00c04f33;
        _rc->id = 1;
        cbs._0_4_ = nghttp2_session_upgrade2
                              (*(nghttp2_session **)stream,(uint8_t *)&binlen,(size_t)iv[2],
                               (uint)((pCStack_18->state).httpreq == '\x05'),(void *)0x0);
        pCVar1 = pCStack_18;
        if ((uint)cbs != 0) {
          pcVar3 = nghttp2_strerror((uint)cbs);
          Curl_failf(pCVar1,"nghttp2_session_upgrade2() failed: %s(%d)",pcVar3,(ulong)(uint)cbs);
          cbs._4_4_ = CURLE_HTTP2;
          goto LAB_00c04f33;
        }
        cbs._0_4_ = nghttp2_session_set_stream_user_data
                              (*(nghttp2_session **)stream,_rc->id,pCStack_18);
        if ((((uint)cbs != 0) && (pCStack_18 != (Curl_easy *)0x0)) &&
           ((*(ulong *)&(pCStack_18->set).field_0x8ba >> 0x1c & 1) != 0)) {
          Curl_infof(pCStack_18,"http/2: failed to set user_data for stream %u",(ulong)(uint)_rc->id
                    );
        }
        if (((pCStack_18 != (Curl_easy *)0x0) &&
            ((*(ulong *)&(pCStack_18->set).field_0x8ba >> 0x1c & 1) != 0)) &&
           ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
          Curl_trc_cf_infof(pCStack_18,(Curl_cfilter *)data_local,"created session via Upgrade");
        }
      }
      cbs._0_4_ = nghttp2_session_set_local_window_size
                            (*(nghttp2_session **)stream,'\0',0,0x3e800000);
      pCVar1 = pCStack_18;
      if ((uint)cbs == 0) {
        cbs._4_4_ = CURLE_OK;
        if (((pCStack_18 != (Curl_easy *)0x0) &&
            ((*(ulong *)&(pCStack_18->set).field_0x8ba >> 0x1c & 1) != 0)) &&
           ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
          pcVar3 = "";
          if ((ctx._7_1_ & 1) != 0) {
            pcVar3 = " (via h1 upgrade)";
          }
          Curl_trc_cf_infof(pCStack_18,(Curl_cfilter *)data_local,"[0] created h2 session%s",pcVar3)
          ;
        }
      }
      else {
        pcVar3 = nghttp2_strerror((uint)cbs);
        Curl_failf(pCVar1,"nghttp2_session_set_local_window_size() failed: %s(%d)",pcVar3,
                   (ulong)(uint)cbs);
        cbs._4_4_ = CURLE_HTTP2;
      }
    }
    else {
      Curl_failf(pCStack_18,"Couldn\'t initialize nghttp2");
    }
  }
  else {
    Curl_failf(pCStack_18,"Couldn\'t initialize nghttp2 callbacks");
  }
LAB_00c04f33:
  if (local_40 != (nghttp2_session_callbacks *)0x0) {
    nghttp2_session_callbacks_del(local_40);
  }
  return cbs._4_4_;
}

Assistant:

static CURLcode cf_h2_ctx_init(struct Curl_cfilter *cf,
                               struct Curl_easy *data,
                               bool via_h1_upgrade)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  struct stream_ctx *stream;
  CURLcode result = CURLE_OUT_OF_MEMORY;
  int rc;
  nghttp2_session_callbacks *cbs = NULL;

  DEBUGASSERT(!ctx->h2);
  Curl_bufcp_init(&ctx->stream_bufcp, H2_CHUNK_SIZE, H2_STREAM_POOL_SPARES);
  Curl_bufq_initp(&ctx->inbufq, &ctx->stream_bufcp, H2_NW_RECV_CHUNKS, 0);
  Curl_bufq_initp(&ctx->outbufq, &ctx->stream_bufcp, H2_NW_SEND_CHUNKS, 0);
  ctx->last_stream_id = 2147483647;

  rc = nghttp2_session_callbacks_new(&cbs);
  if(rc) {
    failf(data, "Couldn't initialize nghttp2 callbacks");
    goto out;
  }

  nghttp2_session_callbacks_set_send_callback(cbs, send_callback);
  nghttp2_session_callbacks_set_on_frame_recv_callback(cbs, on_frame_recv);
#ifndef CURL_DISABLE_VERBOSE_STRINGS
  nghttp2_session_callbacks_set_on_frame_send_callback(cbs, on_frame_send);
#endif
  nghttp2_session_callbacks_set_on_data_chunk_recv_callback(
    cbs, on_data_chunk_recv);
  nghttp2_session_callbacks_set_on_stream_close_callback(cbs, on_stream_close);
  nghttp2_session_callbacks_set_on_begin_headers_callback(
    cbs, on_begin_headers);
  nghttp2_session_callbacks_set_on_header_callback(cbs, on_header);
  nghttp2_session_callbacks_set_error_callback(cbs, error_callback);

  /* The nghttp2 session is not yet setup, do it */
  rc = h2_client_new(cf, cbs);
  if(rc) {
    failf(data, "Couldn't initialize nghttp2");
    goto out;
  }
  ctx->max_concurrent_streams = DEFAULT_MAX_CONCURRENT_STREAMS;

  if(via_h1_upgrade) {
    /* HTTP/1.1 Upgrade issued. H2 Settings have already been submitted
     * in the H1 request and we upgrade from there. This stream
     * is opened implicitly as #1. */
    uint8_t binsettings[H2_BINSETTINGS_LEN];
    ssize_t binlen; /* length of the binsettings data */

    binlen = populate_binsettings(binsettings, data);
    if(binlen <= 0) {
      failf(data, "nghttp2 unexpectedly failed on pack_settings_payload");
      result = CURLE_FAILED_INIT;
      goto out;
    }

    result = http2_data_setup(cf, data, &stream);
    if(result)
      goto out;
    DEBUGASSERT(stream);
    stream->id = 1;
    /* queue SETTINGS frame (again) */
    rc = nghttp2_session_upgrade2(ctx->h2, binsettings, binlen,
                                  data->state.httpreq == HTTPREQ_HEAD,
                                  NULL);
    if(rc) {
      failf(data, "nghttp2_session_upgrade2() failed: %s(%d)",
            nghttp2_strerror(rc), rc);
      result = CURLE_HTTP2;
      goto out;
    }

    rc = nghttp2_session_set_stream_user_data(ctx->h2, stream->id,
                                              data);
    if(rc) {
      infof(data, "http/2: failed to set user_data for stream %u",
            stream->id);
      DEBUGASSERT(0);
    }
    CURL_TRC_CF(data, cf, "created session via Upgrade");
  }
  else {
    nghttp2_settings_entry iv[H2_SETTINGS_IV_LEN];
    int ivlen;

    ivlen = populate_settings(iv, data);
    rc = nghttp2_submit_settings(ctx->h2, NGHTTP2_FLAG_NONE,
                                 iv, ivlen);
    if(rc) {
      failf(data, "nghttp2_submit_settings() failed: %s(%d)",
            nghttp2_strerror(rc), rc);
      result = CURLE_HTTP2;
      goto out;
    }
  }

  rc = nghttp2_session_set_local_window_size(ctx->h2, NGHTTP2_FLAG_NONE, 0,
                                             HTTP2_HUGE_WINDOW_SIZE);
  if(rc) {
    failf(data, "nghttp2_session_set_local_window_size() failed: %s(%d)",
          nghttp2_strerror(rc), rc);
    result = CURLE_HTTP2;
    goto out;
  }

  /* all set, traffic will be send on connect */
  result = CURLE_OK;
  CURL_TRC_CF(data, cf, "[0] created h2 session%s",
              via_h1_upgrade? " (via h1 upgrade)" : "");

out:
  if(cbs)
    nghttp2_session_callbacks_del(cbs);
  return result;
}